

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  pointer __first;
  pointer __last;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *__buffer;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pair<int_*,_long> pVar16;
  vector<int,_std::allocator<int>_> counts;
  void *mmioAddress;
  vector<int,_std::allocator<int>_> counterIndices;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  long local_60;
  vector<int,_std::allocator<int>_> local_58;
  undefined8 local_40;
  
  iVar2 = pci_system_init();
  if (iVar2 == 0) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0xffffffff00001002;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0xffffffffffffffff;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xff000000030000;
    local_40 = 0;
    uVar3 = pci_id_match_iterator_create();
    do {
      lVar4 = pci_device_next(uVar3);
      if (lVar4 == 0) {
        pci_iterator_destroy(uVar3);
        pcVar9 = "could not find an AMD TONGA GPU\n";
        goto LAB_00102baa;
      }
    } while ((*(ushort *)(lVar4 + 8) & 0xfffe) != 0x6938);
    pci_iterator_destroy(uVar3);
    iVar2 = pci_device_probe(lVar4);
    if (iVar2 == 0) {
      if (*(short *)(lVar4 + 6) == 0x1002) {
        iVar2 = pci_device_map_range(lVar4,*(undefined8 *)(lVar4 + 0xf0),0x40000,0,&local_60);
        if (iVar2 == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_58,
                     (DAT_00106148 - (anonymous_namespace)::counters >> 4) * -0x5555555555555555,
                     (allocator_type *)&local_78);
          auVar1 = _DAT_00104030;
          lVar4 = (anonymous_namespace)::counters;
          if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar7 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            lVar7 = lVar7 + (ulong)(lVar7 == 0);
            lVar4 = lVar7 + -1;
            auVar13._8_4_ = (int)lVar4;
            auVar13._0_8_ = lVar4;
            auVar13._12_4_ = (int)((ulong)lVar4 >> 0x20);
            uVar8 = 0;
            auVar13 = auVar13 ^ _DAT_00104030;
            auVar14 = _DAT_00104020;
            do {
              auVar15 = auVar14 ^ auVar1;
              if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                          auVar13._4_4_ < auVar15._4_4_) & 1)) {
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] = (int)uVar8;
              }
              if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
                  auVar15._12_4_ <= auVar13._12_4_) {
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8 + 1] = (int)uVar8 + 1;
              }
              uVar8 = uVar8 + 2;
              lVar4 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 2;
              auVar14._8_8_ = lVar4 + 2;
              lVar4 = (anonymous_namespace)::counters;
            } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar8);
          }
          do {
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_78,(DAT_00106148 - lVar4 >> 4) * -0x5555555555555555,&local_79);
            iVar2 = 0;
            lVar4 = std::chrono::_V2::steady_clock::now();
            while (__last = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                  __first = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, iVar2 != 100) {
              if ((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar7 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                pcVar9 = (char *)((anonymous_namespace)::counters + 0x28);
                lVar10 = 0;
                do {
                  if (((*(uint *)(pcVar9 + -4) &
                       *(uint *)(local_60 + (ulong)*(uint *)(pcVar9 + -8) * 4)) == 0) ==
                      (bool)*pcVar9) {
                    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] =
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10] + 1;
                  }
                  lVar10 = lVar10 + 1;
                  pcVar9 = pcVar9 + 0x30;
                } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
              }
              lVar7 = std::chrono::_V2::steady_clock::now();
              auVar1 = SEXT816(lVar7 - lVar4) * SEXT816(-0x20c49ba5e353f7cf);
              iVar2 = iVar2 + 1;
              usleep(iVar2 * 10000 + ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)));
            }
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar4 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              pVar16 = std::get_temporary_buffer<int>((lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
              __buffer = pVar16.first;
              if (__buffer == (int *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )__last,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&local_78);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )__last,__buffer,pVar16.second,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&local_78);
              }
              operator_delete(__buffer);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[2J\x1b[1;1H",10);
            std::ostream::flush();
            lVar4 = DAT_00106148;
            if (DAT_00106148 != (anonymous_namespace)::counters) {
              uVar8 = 0;
              do {
                lVar4 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8] * 0x30;
                iVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8]];
                pcVar9 = *(char **)((anonymous_namespace)::counters + lVar4);
                lVar4 = *(long *)((anonymous_namespace)::counters + 8 + lVar4);
                *(undefined8 *)(pci_device_next + *(long *)(std::cout + -0x18)) = 10;
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,pcVar9,lVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 3;
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% ",2);
                iVar12 = iVar2 + 3;
                if (-1 < iVar2) {
                  iVar12 = iVar2;
                }
                *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0;
                iVar12 = iVar12 >> 2;
                iVar11 = iVar12;
                if (3 < iVar2) {
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,anon_var_dwarf_7ca6,3);
                    iVar11 = iVar11 + -1;
                  } while (iVar11 != 0);
                }
                pcVar9 = (char *)(&(anonymous_namespace)::bars)[(iVar2 * 2) % 8];
                sVar6 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar9,sVar6);
                if (iVar2 < 0x7c) {
                  iVar2 = 0x1e;
                  if (0x1e < iVar12) {
                    iVar2 = iVar12;
                  }
                  iVar2 = (iVar2 - iVar12) + 1;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    iVar2 = iVar2 + -1;
                  } while (iVar2 != 0);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                uVar8 = uVar8 + 1;
                lVar4 = (anonymous_namespace)::counters;
              } while (uVar8 < (ulong)((DAT_00106148 - (anonymous_namespace)::counters >> 4) *
                                      -0x5555555555555555));
            }
            if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
              lVar4 = (anonymous_namespace)::counters;
            }
          } while( true );
        }
        pcVar9 = "mmio mem map failed (try to run as root)\n";
      }
      else {
        pcVar9 = "Graphics card is not identified\n";
      }
    }
    else {
      pcVar9 = "could not probe GPU\n";
    }
  }
  else {
    pcVar9 = "could not initialize PCI\n";
  }
LAB_00102baa:
  std::operator<<((ostream *)&std::cerr,pcVar9);
  exit(1);
}

Assistant:

int main()
{
    auto dev = getPCIDevice(); // yes, we leak this
    int sampleCount = 100;

    void* mmioAddress;

    // TODO: better selection of region & size
    if(pci_device_map_range(dev, dev->regions[5].base_addr, 0x40000, 0, &mmioAddress)) {
        std::cerr << "mmio mem map failed (try to run as root)\n";
        std::exit(1);
    }

    std::vector<int> counterIndices(counters.size());
    for(std::size_t i = 0; i < counterIndices.size(); ++i)
        counterIndices[i] = i;

    for(;;) {

        std::vector<int> counts(counters.size());

        auto startTime = std::chrono::steady_clock::now();
        auto interval = 1000000 / sampleCount;

        for(int i = 0; i < sampleCount; ++i) {
            for(std::size_t i = 0; i < counts.size(); ++i) {
                if(counters[i].isIdle) {
                    if(!(readReg(mmioAddress, counters[i].index) & counters[i].mask))
                        ++counts[i];
                } else {
                    if(readReg(mmioAddress, counters[i].index) & counters[i].mask)
                        ++counts[i];
                }
            }

            auto currentTime = std::chrono::steady_clock::now();
            auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(currentTime - startTime);
            usleep((i + 1) * interval - elapsed.count());
        }

        std::stable_sort(
            counterIndices.begin(), counterIndices.end(), [&counts](int a, int b) { return counts[a] > counts[b]; });

        std::cout << "\033[2J\033[1;1H" << std::flush; // clears screen

        for(std::size_t i = 0; i < counters.size(); ++i) {
            printCounter(std::cout, counters[counterIndices[i]].name, counts[counterIndices[i]] * 100 / sampleCount);
            std::cout << "\n";
        }
    }
}